

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O0

void pzshape::TPZShapeTriang::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double *pdVar2;
  int64_t in_RDX;
  TPZFMatrix<double> *in_RSI;
  TPZVec<double> *in_RDI;
  int64_t in_stack_ffffffffffffffe0;
  double dVar3;
  
  pdVar2 = TPZVec<double>::operator[](in_RDI,0);
  dVar3 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](in_RDI,1);
  dVar1 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  *pdVar2 = (1.0 - dVar3) - dVar1;
  pdVar2 = TPZVec<double>::operator[](in_RDI,0);
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  *pdVar2 = dVar3;
  pdVar2 = TPZVec<double>::operator[](in_RDI,1);
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)dVar3);
  *pdVar2 = dVar3;
  pdVar2 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)dVar3);
  *pdVar2 = -1.0;
  pdVar2 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)dVar3);
  *pdVar2 = -1.0;
  pdVar2 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)dVar3);
  *pdVar2 = 1.0;
  pdVar2 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)dVar3);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)dVar3);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)dVar3);
  *pdVar2 = 1.0;
  return;
}

Assistant:

void TPZShapeTriang::ShapeCorner(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
		
		phi(0,0) =  1.-pt[0]-pt[1];
		phi(1,0) =  pt[0];
		phi(2,0) =  pt[1];
		dphi(0,0) = -1.;
		dphi(1,0) = -1.;
		dphi(0,1) =  1.;
		dphi(1,1) =  0.;
		dphi(0,2) =  0.;
		dphi(1,2) =  1.;
	}